

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffghprll(fitsfile *fptr,int maxdim,int *simple,int *bitpix,int *naxis,LONGLONG *naxes,
            long *pcount,long *gcount,int *extend,int *status)

{
  int idummy;
  double ddummy;
  LONGLONG lldummy;
  int local_1c;
  double local_18;
  LONGLONG local_10;
  
  ffgphd(fptr,maxdim,simple,bitpix,naxis,naxes,pcount,gcount,extend,&local_18,&local_18,&local_10,
         &local_1c,status);
  return *status;
}

Assistant:

int ffghprll(fitsfile *fptr,  /* I - FITS file pointer                        */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *simple,     /* O - does file conform to FITS standard? 1/0  */
           int *bitpix,     /* O - number of bits per data value pixel      */
           int *naxis,      /* O - number of axes in the data array         */
           LONGLONG naxes[],    /* O - length of each data axis                 */
           long *pcount,    /* O - number of group parameters (usually 0)   */
           long *gcount,    /* O - number of random groups (usually 1 or 0) */
           int *extend,     /* O - may FITS file haave extensions?          */
           int *status)     /* IO - error status                            */
/*
  Get keywords from the Header of the PRimary array:
  Check that the keywords conform to the FITS standard and return the
  parameters which determine the size and structure of the primary array
  or IMAGE extension.
*/
{
    int idummy;
    LONGLONG lldummy;
    double ddummy;

    ffgphd(fptr, maxdim, simple, bitpix, naxis, naxes, pcount, gcount, extend,
          &ddummy, &ddummy, &lldummy, &idummy, status);

    return(*status);
}